

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd2D.c
# Opt level: O0

void dump_2D_fdtd(fdtd2D *fdtd,char *fileName,dumpable_data what_to_dump)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  FILE *__stream;
  uint in_EDX;
  char *in_RSI;
  double *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  uintmax_t j;
  uintmax_t i;
  float_type_0_ *data;
  FILE *out;
  double local_38;
  double local_30;
  double local_28;
  
  __stream = fopen(in_RSI,"w");
  local_28 = in_RDI[3];
  dVar1 = in_RDI[0x1a];
  switch(in_EDX) {
  case 2:
    break;
  case 3:
    local_28 = in_RDI[4];
    break;
  case 4:
    local_28 = in_RDI[5];
    break;
  default:
    fprintf(_stderr,"Dump of \"%s\" not available for 2D fdtd\n",dumpable_data_name[in_EDX]);
    exit(1);
  case 6:
    local_28 = in_RDI[6];
    break;
  case 7:
    local_28 = in_RDI[7];
  }
  for (local_30 = 0.0; (ulong)local_30 < (ulong)in_RDI[0x19];
      local_30 = (double)((long)local_30 + 1)) {
    for (local_38 = 4.94065645841247e-324; (ulong)local_38 < (ulong)in_RDI[0x1a];
        local_38 = (double)((long)local_38 + 1)) {
      auVar4 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,local_30);
      dVar2 = auVar4._0_8_ * *in_RDI;
      in_ZMM0 = ZEXT864((ulong)dVar2);
      auVar4 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,local_38);
      dVar3 = auVar4._0_8_ * in_RDI[1];
      in_ZMM1 = ZEXT864((ulong)dVar3);
      fprintf(__stream,"%e %e %e\n",dVar2,dVar3,
              *(undefined8 *)
               ((long)local_28 + (long)dVar1 * (long)local_30 * 8 + (long)local_38 * 8));
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void dump_2D_fdtd(const struct fdtd2D *fdtd, const char *fileName,
                  enum dumpable_data what_to_dump) {
  FILE *out = fopen(fileName, "w");
  VLA_2D_definition(float_type, fdtd->sizeX, fdtd->sizeY, data, fdtd->ez);
  switch (what_to_dump) {
  case dump_ez:
    break;
  case dump_hx:
    data = fdtd->hx;
    break;
  case dump_hy:
    data = fdtd->hy;
    break;
  case dump_permeability:
    data = fdtd->permeability_inv;
    break;
  case dump_permittivity:
    data = fdtd->permittivity_inv;
    break;
  default:
    fprintf(stderr, "Dump of \"%s\" not available for 2D fdtd\n",
            dumpable_data_name[what_to_dump]);
    exit(EXIT_FAILURE);
  }
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i) {
    for (uintmax_t j = 1; j < fdtd->sizeY; ++j) {
      fprintf(out, "%e %e %e\n", (float_type)i * fdtd->dx,
              (float_type)j * fdtd->dy, data[i][j]);
    }
  }
  fclose(out);
}